

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteLoop<long,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::VectorStringCastOperator<duckdb::NumericTryCastToBit>>
               (long *ldata,string_t *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  idx_t iVar2;
  undefined8 uVar3;
  ulong uVar4;
  idx_t row_idx;
  ulong uVar5;
  char **ppcVar6;
  string_t sVar7;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    ppcVar6 = &(result_data->value).pointer.ptr;
    for (uVar5 = 0; count != uVar5; uVar5 = uVar5 + 1) {
      uVar4 = uVar5;
      if (sel_vector->sel_vector != (sel_t *)0x0) {
        uVar4 = (ulong)sel_vector->sel_vector[uVar5];
      }
      sVar7 = NumericTryCastToBit::Operation<long>(ldata[uVar4],(Vector *)dataptr);
      uVar3 = sVar7.value._0_8_;
      paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar6 + -1);
      paVar1->length = (int)uVar3;
      paVar1->prefix[0] = (char)((ulong)uVar3 >> 0x20);
      paVar1->prefix[1] = (char)((ulong)uVar3 >> 0x28);
      paVar1->prefix[2] = (char)((ulong)uVar3 >> 0x30);
      paVar1->prefix[3] = (char)((ulong)uVar3 >> 0x38);
      *ppcVar6 = sVar7.value._8_8_;
      ppcVar6 = ppcVar6 + 2;
    }
  }
  else {
    ppcVar6 = &(result_data->value).pointer.ptr;
    for (row_idx = 0; count != row_idx; row_idx = row_idx + 1) {
      iVar2 = row_idx;
      if (sel_vector->sel_vector != (sel_t *)0x0) {
        iVar2 = (idx_t)sel_vector->sel_vector[row_idx];
      }
      if (((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask[iVar2 >> 6] >>
           (iVar2 & 0x3f) & 1) == 0) {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&result_mask->super_TemplatedValidityMask<unsigned_long>,row_idx);
      }
      else {
        sVar7 = NumericTryCastToBit::Operation<long>(ldata[iVar2],(Vector *)dataptr);
        uVar3 = sVar7.value._0_8_;
        paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar6 + -1);
        paVar1->length = (int)uVar3;
        paVar1->prefix[0] = (char)((ulong)uVar3 >> 0x20);
        paVar1->prefix[1] = (char)((ulong)uVar3 >> 0x28);
        paVar1->prefix[2] = (char)((ulong)uVar3 >> 0x30);
        paVar1->prefix[3] = (char)((ulong)uVar3 >> 0x38);
        *ppcVar6 = sVar7.value._8_8_;
      }
      ppcVar6 = ppcVar6 + 2;
    }
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}